

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddTriangleProxy
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          ChVector<double> *p1,ChVector<double> *p2,ChVector<double> *p3,ChVector<double> *ep1,
          ChVector<double> *ep2,ChVector<double> *ep3,bool mowns_vertex_1,bool mowns_vertex_2,
          bool mowns_vertex_3,bool mowns_edge_1,bool mowns_edge_2,bool mowns_edge_3,
          double msphereswept_rad)

{
  ChCollisionShapeBullet *this_00;
  cbtCEtriangleShape *this_01;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_88;
  ChMatrix33<double> local_78;
  
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])();
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,TRIANGLE,(shared_ptr<chrono::ChMaterialSurface> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  this_01 = (cbtCEtriangleShape *)cbtConvexInternalShape::operator_new(0x88);
  cbtCEtriangleShape::cbtCEtriangleShape
            (this_01,p1,p2,p3,ep1,ep2,ep3,mowns_vertex_1,mowns_vertex_2,mowns_vertex_3,mowns_edge_1,
             mowns_edge_2,mowns_edge_3,msphereswept_rad);
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*(this_01->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xb])(this_01);
  ChMatrix33<double>::ChMatrix33(&local_78,1.0);
  injectShape(this,(ChVector<double> *)&VNULL,&local_78,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddTriangleProxy(std::shared_ptr<ChMaterialSurface> material,
                                              ChVector<>* p1,
                                              ChVector<>* p2,
                                              ChVector<>* p3,
                                              ChVector<>* ep1,
                                              ChVector<>* ep2,
                                              ChVector<>* ep3,
                                              bool mowns_vertex_1,
                                              bool mowns_vertex_2,
                                              bool mowns_vertex_3,
                                              bool mowns_edge_1,
                                              bool mowns_edge_2,
                                              bool mowns_edge_3,
                                              double msphereswept_rad) {
    // adjust default inward 'safe' margin (always as radius)
    SetSafeMargin(msphereswept_rad);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::TRIANGLE, material);

    shape->m_bt_shape =
        new cbtCEtriangleShape(p1, p2, p3, ep1, ep2, ep3, mowns_vertex_1, mowns_vertex_2, mowns_vertex_3, mowns_edge_1,
                               mowns_edge_2, mowns_edge_3, msphereswept_rad);
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(VNULL, ChMatrix33<>(1), shape);
    return true;
}